

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressreporter.cpp
# Opt level: O2

void __thiscall pbrt::ProgressReporter::launchThread(ProgressReporter *this)

{
  bool bVar1;
  Barrier *this_00;
  pointer *__ptr;
  long *local_28;
  thread local_20;
  
  this_00 = (Barrier *)operator_new(0x60);
  Barrier::Barrier(this_00,2);
  local_20._M_id._M_thread = (id)0;
  local_28 = (long *)operator_new(0x18);
  *local_28 = (long)&PTR___State_02db71f0;
  local_28[1] = (long)this;
  local_28[2] = (long)this_00;
  std::thread::_M_start_thread(&local_20,&local_28,0);
  if (local_28 != (long *)0x0) {
    (**(code **)(*local_28 + 8))();
  }
  std::thread::operator=(&this->updateThread,&local_20);
  std::thread::~thread(&local_20);
  bVar1 = Barrier::Block(this_00);
  if (bVar1) {
    std::condition_variable::~condition_variable(&this_00->cv);
    operator_delete(this_00,0x60);
  }
  return;
}

Assistant:

void ProgressReporter::launchThread() {
    Barrier *barrier = new Barrier(2);
    updateThread = std::thread([this, barrier]() {
#if NVTX
#ifdef PBRT_IS_WINDOWS
        nvtxNameOsThread(GetCurrentThreadId(), "PBRT_PROGRESS_BAR");
#else
        nvtxNameOsThread(syscall(SYS_gettid), "PBRT_PROGRESS_BAR");
#endif
#endif
        if (barrier->Block())
            delete barrier;
        printBar();
    });
    // Wait for the thread to get past the ProfilerWorkerThreadInit()
    // call.
    if (barrier->Block())
        delete barrier;
}